

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.h
# Opt level: O1

int __thiscall basisu::gpu_image::init(gpu_image *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  void *pvVar2;
  uint32_t in_ECX;
  uint32_t uVar3;
  uint32_t in_EDX;
  uint32_t new_size;
  uint uVar4;
  texture_format tVar5;
  
  tVar5 = (texture_format)ctx;
  this->m_fmt = tVar5;
  this->m_width = in_EDX;
  this->m_height = in_ECX;
  uVar1 = (uint)(tVar5 == cFXT1_RGB);
  uVar4 = in_EDX + uVar1 * 4 + 3 >> (tVar5 == cFXT1_RGB | 2U);
  this->m_block_width = uVar1 * 4 + 4;
  this->m_block_height = 4;
  this->m_blocks_x = uVar4;
  uVar1 = in_ECX + 3 >> 2;
  this->m_blocks_y = uVar1;
  uVar3 = 2;
  if ((uint)tVar5 < 0x17) {
    uVar3 = *(uint32_t *)(&DAT_0031ad24 + ((ulong)ctx & 0xffffffff) * 4);
  }
  this->m_qwords_per_block = uVar3;
  if ((this->m_blocks).m_size != 0) {
    (this->m_blocks).m_size = 0;
  }
  uVar4 = uVar4 * uVar1 * uVar3;
  uVar1 = (this->m_blocks).m_size;
  if (uVar1 != uVar4) {
    if (uVar1 <= uVar4) {
      if ((this->m_blocks).m_capacity < uVar4) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_blocks,uVar4,uVar1 + 1 == uVar4,8,(object_mover)0x0,
                   false);
      }
      uVar1 = (this->m_blocks).m_size;
      pvVar2 = memset((this->m_blocks).m_p + uVar1,0,(ulong)(uVar4 - uVar1) << 3);
      uVar1 = (uint)pvVar2;
    }
    (this->m_blocks).m_size = uVar4;
  }
  return uVar1;
}

Assistant:

void init(texture_format fmt, uint32_t width, uint32_t height)
		{
			m_fmt = fmt;
			m_width = width;
			m_height = height;
			m_block_width = basisu::get_block_width(m_fmt);
			m_block_height = basisu::get_block_height(m_fmt);
			m_blocks_x = (m_width + m_block_width - 1) / m_block_width;
			m_blocks_y = (m_height + m_block_height - 1) / m_block_height;
			m_qwords_per_block = basisu::get_qwords_per_block(m_fmt);

			m_blocks.resize(0);
			m_blocks.resize(m_blocks_x * m_blocks_y * m_qwords_per_block);
		}